

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int reparse_equality_expr(lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t exp_idx_00;
  int iVar1;
  bool bVar2;
  uint16_t local_24;
  uint16_t prev_rel_exp;
  uint16_t prev_eq_exp;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  while( true ) {
    exp_idx_00 = *exp_idx;
    local_24 = *exp_idx;
    iVar1 = reparse_additive_expr(exp,exp_idx);
    if (iVar1 != 0) {
      return -1;
    }
    while( true ) {
      iVar1 = exp_check_token(exp,*exp_idx,LYXP_TOKEN_OPERATOR_COMP,0);
      bVar2 = false;
      if ((iVar1 == 0) && (bVar2 = true, exp->expr[exp->expr_pos[*exp_idx]] != '<')) {
        bVar2 = exp->expr[exp->expr_pos[*exp_idx]] == '>';
      }
      if (!bVar2) break;
      exp_repeat_push(exp,local_24,*exp_idx);
      *exp_idx = *exp_idx + 1;
      local_24 = *exp_idx;
      iVar1 = reparse_additive_expr(exp,exp_idx);
      if (iVar1 != 0) {
        return -1;
      }
    }
    iVar1 = exp_check_token(exp,*exp_idx,LYXP_TOKEN_OPERATOR_COMP,0);
    bVar2 = false;
    if ((iVar1 == 0) && (bVar2 = true, exp->expr[exp->expr_pos[*exp_idx]] != '=')) {
      bVar2 = exp->expr[exp->expr_pos[*exp_idx]] == '!';
    }
    if (!bVar2) break;
    exp_repeat_push(exp,exp_idx_00,*exp_idx);
    *exp_idx = *exp_idx + 1;
  }
  return 0;
}

Assistant:

static int
reparse_equality_expr(struct lyxp_expr *exp, uint16_t *exp_idx)
{
    uint16_t prev_eq_exp, prev_rel_exp;

    goto reparse_additive_expr;

    /* ('=' / '!=' RelationalExpr)* */
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_COMP, 0)
            && ((exp->expr[exp->expr_pos[*exp_idx]] == '=') || (exp->expr[exp->expr_pos[*exp_idx]] == '!'))) {
        exp_repeat_push(exp, prev_eq_exp, *exp_idx);
        ++(*exp_idx);

reparse_additive_expr:
        prev_eq_exp = *exp_idx;
        prev_rel_exp = *exp_idx;

        /* AdditiveExpr */
        if (reparse_additive_expr(exp, exp_idx)) {
            return -1;
        }

        /* ('<' / '>' / '<=' / '>=' AdditiveExpr)* */
        while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_COMP, 0)
                && ((exp->expr[exp->expr_pos[*exp_idx]] == '<') || (exp->expr[exp->expr_pos[*exp_idx]] == '>'))) {
            exp_repeat_push(exp, prev_rel_exp, *exp_idx);
            ++(*exp_idx);

            prev_rel_exp = *exp_idx;
            if (reparse_additive_expr(exp, exp_idx)) {
                return -1;
            }
        }
    }

    return EXIT_SUCCESS;
}